

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::deinit(TessellationShaderTCTEgl_TessLevel *this)

{
  bool bVar1;
  int iVar2;
  ContextType type;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference test_ptr;
  __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
  local_48;
  __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
  local_40;
  iterator it;
  float default_levels [4];
  Functions *gl;
  TessellationShaderTCTEgl_TessLevel *this_local;
  long lVar4;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) != 0) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x40))(0x8c8e,0);
    (**(code **)(lVar4 + 0x48))(0x8c8e,0);
    (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
    type.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
    bVar1 = glu::isContextTypeES(type);
    if (!bVar1) {
      it._M_current = (_test_descriptor *)0x3f8000003f800000;
      (**(code **)(lVar4 + 0xfd0))(0x8e73,&it);
      (**(code **)(lVar4 + 0xfd0))(0x8e74,&it);
    }
    (**(code **)(lVar4 + 0x4e8))(0x8c89);
    (**(code **)(lVar4 + 0xd8))(0);
    if (this->m_bo_id != 0) {
      (**(code **)(lVar4 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar4 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
    local_40._M_current =
         (_test_descriptor *)
         std::
         vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
         ::begin(&this->m_tests);
    while( true ) {
      local_48._M_current =
           (_test_descriptor *)
           std::
           vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
           ::end(&this->m_tests);
      bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
      if (!bVar1) break;
      test_ptr = __gnu_cxx::
                 __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
                 ::operator*(&local_40);
      deinitTestDescriptor(this,test_ptr);
      __gnu_cxx::
      __normal_iterator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor_*,_std::vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>_>
      ::operator++(&local_40);
    }
    std::
    vector<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor,_std::allocator<glcts::TessellationShaderTCTEgl_TessLevel::_test_descriptor>_>
    ::clear(&this->m_tests);
  }
  return;
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::deinit()
{
	/** Call base class' deinit() function */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset TF buffer object bindings */
	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* buffer */);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, 0 /* buffer */);

	/* Reset GL_PATCH_VERTICES_EXT value to the default setting */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);

	if (!glu::isContextTypeES(m_context.getRenderContext().getType()))
	{
		/* Revert GL_PATCH_DEFAULT_INNER_LEVEL and GL_PATCH_DEFAULT_OUTER_LEVEL pname
		 * values to the default settings */
		const float default_levels[] = { 1.0f, 1.0f, 1.0f, 1.0f };
		gl.patchParameterfv(GL_PATCH_DEFAULT_INNER_LEVEL, default_levels);
		gl.patchParameterfv(GL_PATCH_DEFAULT_OUTER_LEVEL, default_levels);
	}

	/* Disable GL_RASTERIZER_DISCARD mode */
	gl.disable(GL_RASTERIZER_DISCARD);

	/* Unbind vertex array object */
	gl.bindVertexArray(0);

	/* Release all objects we might've created */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	for (_tests::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		deinitTestDescriptor(&*it);
	}
	m_tests.clear();
}